

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covec.cpp
# Opt level: O2

int main(int narg,char **argv)

{
  pointer psVar1;
  pointer pbVar2;
  pointer pbVar3;
  pointer pdVar4;
  pointer pdVar5;
  mapped_type mVar6;
  element_type *peVar7;
  element_type *peVar8;
  pointer pvVar9;
  pointer pvVar10;
  pointer pfVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  pointer psVar13;
  pointer psVar14;
  pointer psVar15;
  undefined8 dim;
  undefined8 uVar16;
  undefined8 neg_size;
  undefined8 __n;
  undefined4 sigma;
  undefined4 eta0;
  undefined4 eta1;
  bool bVar17;
  char cVar18;
  bool bVar19;
  bool bVar20;
  uint uVar21;
  shared_ptr<(anonymous_namespace)::CodeBook> *__cur;
  long lVar22;
  istream *piVar23;
  long lVar24;
  pointer psVar25;
  undefined8 *puVar26;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
  _Var27;
  mapped_type *pmVar28;
  result_type_conflict1 rVar29;
  ulong uVar30;
  long lVar31;
  ostream *poVar32;
  ulong uVar33;
  ulong uVar34;
  pointer puVar35;
  int iVar36;
  shared_ptr<(anonymous_namespace)::CodeBook> *__cur_1;
  ulong uVar37;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  pointer psVar38;
  long lVar39;
  pointer pcVar40;
  ulong uVar41;
  long lVar42;
  pointer pvVar43;
  size_t i;
  ulong uVar44;
  size_t count;
  pointer pcVar45;
  unsigned_long uVar46;
  size_type sVar47;
  _Bit_pointer puVar48;
  size_type sVar49;
  double dVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  reference rVar53;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_false,_true>,_bool>
  pVar54;
  vector<bool,_std::allocator<bool>_> first_of_sharings;
  vector<bool,_std::allocator<bool>_> first_of_sharings_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> instance;
  string line;
  ulong local_1850;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  data;
  long local_1828;
  string input_file;
  vector<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
  codebooks;
  vector<unsigned_long,_std::allocator<unsigned_long>_> share;
  reference_wrapper<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>
  local_17b0;
  __normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  local_17a8;
  size_t batch_size;
  vector<std::shared_ptr<std::discrete_distribution<int>_>,_std::allocator<std::shared_ptr<std::discrete_distribution<int>_>_>_>
  probs;
  Covec<float> cv;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  new_code2entries;
  undefined1 local_16b0 [64];
  _Alloc_hider local_1670;
  size_type local_1668;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1660;
  string local_1650 [32];
  char local_1630;
  _Alloc_hider local_1628;
  size_type local_1620;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1618;
  undefined2 local_1608;
  string share_str;
  string output_prefix;
  string help_message;
  int aiStack_15a0 [122];
  mt19937 gen;
  
  local_16b0._0_8_ = 2;
  local_16b0._8_8_ = 0x80;
  local_16b0._16_8_ = 0x20;
  local_16b0._24_8_ = 1;
  local_16b0._32_8_ = 1;
  local_16b0._40_8_ = 8;
  local_16b0._48_4_ = 0.1;
  local_16b0._52_4_ = 0.005;
  local_16b0._56_4_ = 1e-05;
  local_16b0[0x3c] = false;
  local_1670._M_p = (pointer)&local_1660;
  local_1668 = 0;
  local_1660._M_local_buf[0] = '\0';
  std::__cxx11::string::string(local_1650,"result",(allocator *)&gen);
  local_1628._M_p = (pointer)&local_1618;
  local_1630 = '\t';
  local_1620 = 0;
  local_1618._M_local_buf[0] = '\0';
  local_1608._0_1_ = false;
  local_1608._1_1_ = false;
  std::__cxx11::string::string((string *)&gen,*argv,(allocator *)&help_message);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &first_of_sharings,"usage: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gen);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cv,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &first_of_sharings," -i input_file [ options ]\n");
  std::operator+(&help_message,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cv,
                 "Options and arguments:\n--dim, -d DIM=128                       : the dimension of vectors\n--batch_size, -b BATCH_SIZE=32          : the (mini)batch size\n--num_epochs, -n NUM_EPOCHS=1           : the number of epochs\n--neg_size, -N NEGSIZE=1                : the size of negative sampling\n--num_threads, -T NUM_THREADS=8         : the number of threads\n--sigma, -s SIGMA=0.1                   : initialize each element of vector with Normal(0, SIGMA)\n--eta0, -e ETA0=0.005                   : initial learning rate for SGD\n--eta1, -E ETA1=0.00001                 : final learning rate for SGD\n--enable_chopout                        : set this flag to enable chopout\n--input_file, -i INPUT_FILE             : input file. supposed that each line is separated by SEP\n--output_prefix, -o OUTPUT_PREFIX=\"vec\" : output file prefix\n--sep, -S SEP=\'\t\'                       : separator of each line in INPUT_FILE\n--help, -h                              : show this help message\n--shuffle                               : enuable the switch to shuffle data before every epoch\n--sort                                  : sort entries by descending order of frequency\n--share INDICES                         : set this option to share parameter through different orders. if \"0,1,0\" is set, order 0 and 2 share parameters."
                );
  std::__cxx11::string::~string((string *)&cv);
  std::__cxx11::string::~string((string *)&first_of_sharings);
  iVar36 = 1;
  bVar20 = false;
LAB_001116d1:
  if (narg <= iVar36) goto LAB_00112202;
  std::__cxx11::string::string((string *)&cv,argv[iVar36],(allocator *)&line);
  std::__cxx11::string::string((string *)&first_of_sharings,"--dim",(allocator *)&instance);
  std::__cxx11::string::string((string *)&first_of_sharings_1,"-d",(allocator *)&input_file);
  bVar19 = match((string *)&cv,(string *)&first_of_sharings,(string *)&first_of_sharings_1);
  std::__cxx11::string::~string((string *)&first_of_sharings_1);
  std::__cxx11::string::~string((string *)&first_of_sharings);
  std::__cxx11::string::~string((string *)&cv);
  if (bVar19) {
    std::__cxx11::string::string
              ((string *)&cv,argv[(long)iVar36 + 1],(allocator *)&first_of_sharings);
    uVar21 = std::__cxx11::stoi((string *)&cv,(size_t *)0x0,10);
    std::__cxx11::string::~string((string *)&cv);
    if ((int)uVar21 < 1) {
      poVar32 = std::operator<<((ostream *)&std::cerr,"dim must be > 0 but given: ");
      poVar32 = (ostream *)std::ostream::operator<<(poVar32,uVar21);
      std::endl<char,std::char_traits<char>>(poVar32);
      goto LAB_00113d9e;
    }
    iVar36 = iVar36 + 1;
    local_16b0._8_8_ = ZEXT48(uVar21);
  }
  else {
    std::__cxx11::string::string((string *)&cv,argv[iVar36],(allocator *)&line);
    std::__cxx11::string::string((string *)&first_of_sharings,"--batch_size",(allocator *)&instance)
    ;
    std::__cxx11::string::string((string *)&first_of_sharings_1,"-b",(allocator *)&input_file);
    bVar19 = match((string *)&cv,(string *)&first_of_sharings,(string *)&first_of_sharings_1);
    std::__cxx11::string::~string((string *)&first_of_sharings_1);
    std::__cxx11::string::~string((string *)&first_of_sharings);
    std::__cxx11::string::~string((string *)&cv);
    if (bVar19) {
      std::__cxx11::string::string
                ((string *)&cv,argv[(long)iVar36 + 1],(allocator *)&first_of_sharings);
      uVar21 = std::__cxx11::stoi((string *)&cv,(size_t *)0x0,10);
      std::__cxx11::string::~string((string *)&cv);
      if ((int)uVar21 < 1) {
        poVar32 = std::operator<<((ostream *)&std::cerr,"batch_size must be > 0 but given: ");
        poVar32 = (ostream *)std::ostream::operator<<(poVar32,uVar21);
        std::endl<char,std::char_traits<char>>(poVar32);
        goto LAB_00113d9e;
      }
      iVar36 = iVar36 + 1;
      local_16b0._16_8_ = ZEXT48(uVar21);
    }
    else {
      std::__cxx11::string::string((string *)&cv,argv[iVar36],(allocator *)&line);
      std::__cxx11::string::string
                ((string *)&first_of_sharings,"--num_epochs",(allocator *)&instance);
      std::__cxx11::string::string((string *)&first_of_sharings_1,"-n",(allocator *)&input_file);
      bVar19 = match((string *)&cv,(string *)&first_of_sharings,(string *)&first_of_sharings_1);
      std::__cxx11::string::~string((string *)&first_of_sharings_1);
      std::__cxx11::string::~string((string *)&first_of_sharings);
      std::__cxx11::string::~string((string *)&cv);
      if (bVar19) {
        std::__cxx11::string::string
                  ((string *)&cv,argv[(long)iVar36 + 1],(allocator *)&first_of_sharings);
        uVar21 = std::__cxx11::stoi((string *)&cv,(size_t *)0x0,10);
        std::__cxx11::string::~string((string *)&cv);
        if ((int)uVar21 < 1) {
          poVar32 = std::operator<<((ostream *)&std::cerr,"num_epochs must be > 0 but given: ");
          poVar32 = (ostream *)std::ostream::operator<<(poVar32,uVar21);
          std::endl<char,std::char_traits<char>>(poVar32);
          goto LAB_00113d9e;
        }
        iVar36 = iVar36 + 1;
        local_16b0._24_8_ = ZEXT48(uVar21);
      }
      else {
        std::__cxx11::string::string((string *)&cv,argv[iVar36],(allocator *)&line);
        std::__cxx11::string::string
                  ((string *)&first_of_sharings,"--neg_size",(allocator *)&instance);
        std::__cxx11::string::string((string *)&first_of_sharings_1,"-N",(allocator *)&input_file);
        bVar19 = match((string *)&cv,(string *)&first_of_sharings,(string *)&first_of_sharings_1);
        std::__cxx11::string::~string((string *)&first_of_sharings_1);
        std::__cxx11::string::~string((string *)&first_of_sharings);
        std::__cxx11::string::~string((string *)&cv);
        if (bVar19) {
          std::__cxx11::string::string
                    ((string *)&cv,argv[(long)iVar36 + 1],(allocator *)&first_of_sharings);
          uVar21 = std::__cxx11::stoi((string *)&cv,(size_t *)0x0,10);
          std::__cxx11::string::~string((string *)&cv);
          if ((int)uVar21 < 1) {
            poVar32 = std::operator<<((ostream *)&std::cerr,"neg_size must be > 0 but given: ");
            poVar32 = (ostream *)std::ostream::operator<<(poVar32,uVar21);
            std::endl<char,std::char_traits<char>>(poVar32);
            goto LAB_00113d9e;
          }
          iVar36 = iVar36 + 1;
          local_16b0._32_8_ = ZEXT48(uVar21);
        }
        else {
          std::__cxx11::string::string((string *)&cv,argv[iVar36],(allocator *)&line);
          std::__cxx11::string::string
                    ((string *)&first_of_sharings,"--num_threads",(allocator *)&instance);
          std::__cxx11::string::string((string *)&first_of_sharings_1,"-T",(allocator *)&input_file)
          ;
          bVar19 = match((string *)&cv,(string *)&first_of_sharings,(string *)&first_of_sharings_1);
          std::__cxx11::string::~string((string *)&first_of_sharings_1);
          std::__cxx11::string::~string((string *)&first_of_sharings);
          std::__cxx11::string::~string((string *)&cv);
          if (bVar19) {
            std::__cxx11::string::string
                      ((string *)&cv,argv[(long)iVar36 + 1],(allocator *)&first_of_sharings);
            uVar21 = std::__cxx11::stoi((string *)&cv,(size_t *)0x0,10);
            std::__cxx11::string::~string((string *)&cv);
            if ((int)uVar21 < 1) {
              poVar32 = std::operator<<((ostream *)&std::cerr,"num_threads must be > 0 but given: ")
              ;
              poVar32 = (ostream *)std::ostream::operator<<(poVar32,uVar21);
              std::endl<char,std::char_traits<char>>(poVar32);
              goto LAB_00113d9e;
            }
            iVar36 = iVar36 + 1;
            local_16b0._40_8_ = ZEXT48(uVar21);
          }
          else {
            std::__cxx11::string::string((string *)&cv,argv[iVar36],(allocator *)&line);
            std::__cxx11::string::string
                      ((string *)&first_of_sharings,"--sigma",(allocator *)&instance);
            std::__cxx11::string::string
                      ((string *)&first_of_sharings_1,"-s",(allocator *)&input_file);
            bVar19 = match((string *)&cv,(string *)&first_of_sharings,(string *)&first_of_sharings_1
                          );
            std::__cxx11::string::~string((string *)&first_of_sharings_1);
            std::__cxx11::string::~string((string *)&first_of_sharings);
            std::__cxx11::string::~string((string *)&cv);
            if (bVar19) {
              std::__cxx11::string::string
                        ((string *)&cv,argv[(long)iVar36 + 1],(allocator *)&first_of_sharings);
              dVar50 = std::__cxx11::stod((string *)&cv,(size_t *)0x0);
              std::__cxx11::string::~string((string *)&cv);
              if (dVar50 <= 0.0) {
                std::operator<<((ostream *)&std::cerr,"sigma must be > 0 but given: ");
                poVar32 = std::ostream::_M_insert<double>(dVar50);
                std::endl<char,std::char_traits<char>>(poVar32);
                goto LAB_00113d9e;
              }
              iVar36 = iVar36 + 1;
              local_16b0._48_4_ = (float)dVar50;
            }
            else {
              std::__cxx11::string::string((string *)&cv,argv[iVar36],(allocator *)&line);
              std::__cxx11::string::string
                        ((string *)&first_of_sharings,"--eta0",(allocator *)&instance);
              std::__cxx11::string::string
                        ((string *)&first_of_sharings_1,"-e",(allocator *)&input_file);
              bVar19 = match((string *)&cv,(string *)&first_of_sharings,
                             (string *)&first_of_sharings_1);
              std::__cxx11::string::~string((string *)&first_of_sharings_1);
              std::__cxx11::string::~string((string *)&first_of_sharings);
              std::__cxx11::string::~string((string *)&cv);
              if (bVar19) {
                std::__cxx11::string::string
                          ((string *)&cv,argv[(long)iVar36 + 1],(allocator *)&first_of_sharings);
                dVar50 = std::__cxx11::stod((string *)&cv,(size_t *)0x0);
                std::__cxx11::string::~string((string *)&cv);
                if (dVar50 <= 0.0) {
                  std::operator<<((ostream *)&std::cerr,"eta0 must be > 0 but given: ");
                  poVar32 = std::ostream::_M_insert<double>(dVar50);
                  std::endl<char,std::char_traits<char>>(poVar32);
                  goto LAB_00113d9e;
                }
                iVar36 = iVar36 + 1;
                local_16b0._52_4_ = (float)dVar50;
              }
              else {
                std::__cxx11::string::string((string *)&cv,argv[iVar36],(allocator *)&line);
                std::__cxx11::string::string
                          ((string *)&first_of_sharings,"--eta1",(allocator *)&instance);
                std::__cxx11::string::string
                          ((string *)&first_of_sharings_1,"-E",(allocator *)&input_file);
                bVar19 = match((string *)&cv,(string *)&first_of_sharings,
                               (string *)&first_of_sharings_1);
                std::__cxx11::string::~string((string *)&first_of_sharings_1);
                std::__cxx11::string::~string((string *)&first_of_sharings);
                std::__cxx11::string::~string((string *)&cv);
                if (bVar19) {
                  std::__cxx11::string::string
                            ((string *)&cv,argv[(long)iVar36 + 1],(allocator *)&first_of_sharings);
                  dVar50 = std::__cxx11::stod((string *)&cv,(size_t *)0x0);
                  std::__cxx11::string::~string((string *)&cv);
                  if (dVar50 <= 0.0) {
                    std::operator<<((ostream *)&std::cerr,"eta1 must be > 0 but given: ");
                    poVar32 = std::ostream::_M_insert<double>(dVar50);
                    std::endl<char,std::char_traits<char>>(poVar32);
                    goto LAB_00113d9e;
                  }
                  iVar36 = iVar36 + 1;
                  local_16b0._56_4_ = (undefined4)dVar50;
                }
                else {
                  std::__cxx11::string::string
                            ((string *)&cv,argv[iVar36],(allocator *)&first_of_sharings_1);
                  std::__cxx11::string::string
                            ((string *)&first_of_sharings,"--enable_chopout",(allocator *)&line);
                  bVar19 = match((string *)&cv,(string *)&first_of_sharings);
                  std::__cxx11::string::~string((string *)&first_of_sharings);
                  std::__cxx11::string::~string((string *)&cv);
                  if (bVar19) {
                    local_16b0[0x3c] = true;
                  }
                  else {
                    std::__cxx11::string::string((string *)&cv,argv[iVar36],(allocator *)&line);
                    std::__cxx11::string::string
                              ((string *)&first_of_sharings,"--input_file",(allocator *)&instance);
                    std::__cxx11::string::string
                              ((string *)&first_of_sharings_1,"-i",(allocator *)&input_file);
                    bVar19 = match((string *)&cv,(string *)&first_of_sharings,
                                   (string *)&first_of_sharings_1);
                    std::__cxx11::string::~string((string *)&first_of_sharings_1);
                    std::__cxx11::string::~string((string *)&first_of_sharings);
                    std::__cxx11::string::~string((string *)&cv);
                    if (bVar19) {
                      std::__cxx11::string::string
                                ((string *)&cv,argv[(long)iVar36 + 1],
                                 (allocator *)&first_of_sharings);
                      std::__cxx11::string::_M_assign((string *)&local_1670);
                      iVar36 = iVar36 + 1;
                      std::__cxx11::string::~string((string *)&cv);
                      bVar20 = true;
                    }
                    else {
                      std::__cxx11::string::string((string *)&cv,argv[iVar36],(allocator *)&line);
                      std::__cxx11::string::string
                                ((string *)&first_of_sharings,"--output_prefix",
                                 (allocator *)&instance);
                      std::__cxx11::string::string
                                ((string *)&first_of_sharings_1,"-o",(allocator *)&input_file);
                      bVar19 = match((string *)&cv,(string *)&first_of_sharings,
                                     (string *)&first_of_sharings_1);
                      std::__cxx11::string::~string((string *)&first_of_sharings_1);
                      std::__cxx11::string::~string((string *)&first_of_sharings);
                      std::__cxx11::string::~string((string *)&cv);
                      if (bVar19) {
                        std::__cxx11::string::string
                                  ((string *)&cv,argv[(long)iVar36 + 1],
                                   (allocator *)&first_of_sharings);
                        std::__cxx11::string::_M_assign(local_1650);
                        cVar18 = local_1630;
                      }
                      else {
                        std::__cxx11::string::string((string *)&cv,argv[iVar36],(allocator *)&line);
                        std::__cxx11::string::string
                                  ((string *)&first_of_sharings,"--sep",(allocator *)&instance);
                        std::__cxx11::string::string
                                  ((string *)&first_of_sharings_1,"-S",(allocator *)&input_file);
                        bVar19 = match((string *)&cv,(string *)&first_of_sharings,
                                       (string *)&first_of_sharings_1);
                        std::__cxx11::string::~string((string *)&first_of_sharings_1);
                        std::__cxx11::string::~string((string *)&first_of_sharings);
                        std::__cxx11::string::~string((string *)&cv);
                        if (!bVar19) {
                          std::__cxx11::string::string
                                    ((string *)&cv,argv[iVar36],(allocator *)&first_of_sharings_1);
                          std::__cxx11::string::string
                                    ((string *)&first_of_sharings,"--shuffle",(allocator *)&line);
                          bVar19 = match((string *)&cv,(string *)&first_of_sharings);
                          std::__cxx11::string::~string((string *)&first_of_sharings);
                          std::__cxx11::string::~string((string *)&cv);
                          if (bVar19) {
                            local_1608._0_1_ = true;
                            goto LAB_001120a6;
                          }
                          std::__cxx11::string::string
                                    ((string *)&cv,argv[iVar36],(allocator *)&first_of_sharings_1);
                          std::__cxx11::string::string
                                    ((string *)&first_of_sharings,"--sort",(allocator *)&line);
                          bVar19 = match((string *)&cv,(string *)&first_of_sharings);
                          std::__cxx11::string::~string((string *)&first_of_sharings);
                          std::__cxx11::string::~string((string *)&cv);
                          if (!bVar19) {
                            std::__cxx11::string::string
                                      ((string *)&cv,argv[iVar36],(allocator *)&first_of_sharings_1)
                            ;
                            std::__cxx11::string::string
                                      ((string *)&first_of_sharings,"--share",(allocator *)&line);
                            bVar19 = match((string *)&cv,(string *)&first_of_sharings);
                            std::__cxx11::string::~string((string *)&first_of_sharings);
                            std::__cxx11::string::~string((string *)&cv);
                            if (bVar19) {
                              std::__cxx11::string::string
                                        ((string *)&cv,argv[(long)iVar36 + 1],
                                         (allocator *)&first_of_sharings);
                              std::__cxx11::string::_M_assign((string *)&local_1628);
                              cVar18 = local_1630;
                              goto LAB_0011209e;
                            }
                            std::__cxx11::string::string
                                      ((string *)&cv,argv[iVar36],(allocator *)&line);
                            std::__cxx11::string::string
                                      ((string *)&first_of_sharings,"--help",(allocator *)&instance)
                            ;
                            std::__cxx11::string::string
                                      ((string *)&first_of_sharings_1,"-h",(allocator *)&input_file)
                            ;
                            bVar20 = match((string *)&cv,(string *)&first_of_sharings,
                                           (string *)&first_of_sharings_1);
                            std::__cxx11::string::~string((string *)&first_of_sharings_1);
                            std::__cxx11::string::~string((string *)&first_of_sharings);
                            std::__cxx11::string::~string((string *)&cv);
                            if (bVar20) {
                              poVar32 = std::operator<<((ostream *)&std::cout,
                                                        (string *)&help_message);
                              std::endl<char,std::char_traits<char>>(poVar32);
                              exit(0);
                            }
                            poVar32 = std::operator<<((ostream *)&std::cerr,"invalid argument: ");
                            poVar32 = std::operator<<(poVar32,argv[iVar36]);
                            std::endl<char,std::char_traits<char>>(poVar32);
                            poVar32 = std::operator<<((ostream *)&std::cerr,(string *)&help_message)
                            ;
                            std::endl<char,std::char_traits<char>>(poVar32);
                            goto LAB_00113d9e;
                          }
                          local_1608._1_1_ = true;
                          goto LAB_001120a6;
                        }
                        std::__cxx11::string::string
                                  ((string *)&cv,argv[(long)iVar36 + 1],
                                   (allocator *)&first_of_sharings);
                        bVar19 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&cv,"\\t");
                        cVar18 = '\t';
                        if (!bVar19) {
                          bVar19 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&cv,"\\s");
                          cVar18 = ' ';
                          if (!bVar19) {
                            if (cv.num_entries_.
                                super__Vector_base<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x1) {
                              poVar32 = std::operator<<((ostream *)&std::cerr,
                                                        "sep must be a character but given : ");
                              poVar32 = std::operator<<(poVar32,(string *)&cv);
                              std::endl<char,std::char_traits<char>>(poVar32);
                              goto LAB_00113d9e;
                            }
                            cVar18 = *(char *)&((cv.num_entries_.
                                                 super__Vector_base<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->
                                               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>
                                               )._M_ptr;
                          }
                        }
                      }
LAB_0011209e:
                      local_1630 = cVar18;
                      iVar36 = iVar36 + 1;
                      std::__cxx11::string::~string((string *)&cv);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_001120a6:
  iVar36 = iVar36 + 1;
  goto LAB_001116d1;
LAB_00112202:
  if (bVar20) {
    std::__cxx11::string::~string((string *)&help_message);
    std::__cxx11::string::~string((string *)&gen);
    bVar20 = local_16b0[0x3c];
    eta1 = local_16b0._56_4_;
    __n = local_16b0._40_8_;
    neg_size = local_16b0._32_8_;
    uVar16 = local_16b0._24_8_;
    dim = local_16b0._8_8_;
    batch_size = local_16b0._16_8_;
    sigma = local_16b0._48_4_;
    eta0 = local_16b0._52_4_;
    std::__cxx11::string::string((string *)&input_file,(string *)&local_1670);
    std::__cxx11::string::string((string *)&output_prefix,local_1650);
    cVar18 = local_1630;
    std::__cxx11::string::string((string *)&share_str,(string *)&local_1628);
    share.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    share.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    share.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    pcVar45 = (pointer)0x0;
    uVar37 = 0;
    do {
      if (share_str._M_string_length <= uVar37) break;
      lVar22 = std::__cxx11::string::find('\0',0x2c);
      std::__cxx11::string::substr((ulong)&gen,(ulong)&share_str);
      iVar36 = std::__cxx11::stoi((string *)&gen,(size_t *)0x0,10);
      pcVar40 = (pointer)(long)iVar36;
      std::__cxx11::string::~string((string *)&gen);
      help_message._M_dataplus._M_p = pcVar40;
      if (pcVar45 < pcVar40) {
        poVar32 = std::operator<<((ostream *)&std::cerr,
                                  "invalid share string (share string should be 0, 1, 2, ... in this order): "
                                 );
        poVar32 = std::operator<<(poVar32,(string *)&share_str);
        std::endl<char,std::char_traits<char>>(poVar32);
        goto LAB_00113d9e;
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (&share,(value_type_conflict1 *)&help_message);
      pcVar45 = pcVar45 + (pcVar45 <= pcVar40);
      uVar37 = lVar22 + 1;
    } while (uVar37 != 0);
    std::ifstream::ifstream(&gen,(string *)&input_file,_S_in);
    if (*(int *)((long)gen._M_x + *(long *)(gen._M_x[0] - 0x18) + 0x20) == 0) {
      help_message._M_dataplus._M_p = (pointer)&help_message.field_2;
      help_message._M_string_length = 0;
      help_message.field_2._M_local_buf[0] = '\0';
      piVar23 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                          ((istream *)&gen,(string *)&help_message);
      if (((byte)piVar23[*(long *)(*(long *)piVar23 + -0x18) + 0x20] & 5) == 0) {
        bVar19 = std::operator==(&help_message,"");
        if (bVar19) {
          poVar32 = std::operator<<((ostream *)&std::cerr,"empty first line in  input file : ");
          poVar32 = std::operator<<(poVar32,(string *)&input_file);
          std::endl<char,std::char_traits<char>>(poVar32);
        }
        else {
          lVar22 = -1;
          lVar39 = -0x10;
          uVar21 = (uint)cVar18;
          while (lVar24 = std::__cxx11::string::find((char)&help_message,(ulong)uVar21),
                lVar24 != -1) {
            lVar22 = lVar22 + -1;
            lVar39 = lVar39 + -0x10;
          }
          std::__cxx11::string::~string((string *)&help_message);
          std::ifstream::~ifstream(&gen);
          bVar19 = local_1608._0_1_;
          bVar17 = local_1608._1_1_;
          poVar32 = std::operator<<((ostream *)&std::cout,"config:");
          std::endl<char,std::char_traits<char>>(poVar32);
          poVar32 = std::operator<<((ostream *)&std::cout,"  ");
          poVar32 = std::operator<<(poVar32,"dim          : ");
          poVar32 = std::ostream::_M_insert<unsigned_long>((ulong)poVar32);
          std::endl<char,std::char_traits<char>>(poVar32);
          poVar32 = std::operator<<((ostream *)&std::cout,"  ");
          poVar32 = std::operator<<(poVar32,"batch_size   : ");
          poVar32 = std::ostream::_M_insert<unsigned_long>((ulong)poVar32);
          std::endl<char,std::char_traits<char>>(poVar32);
          poVar32 = std::operator<<((ostream *)&std::cout,"  ");
          poVar32 = std::operator<<(poVar32,"num_epochs   : ");
          poVar32 = std::ostream::_M_insert<unsigned_long>((ulong)poVar32);
          std::endl<char,std::char_traits<char>>(poVar32);
          poVar32 = std::operator<<((ostream *)&std::cout,"  ");
          poVar32 = std::operator<<(poVar32,"neg_size     : ");
          poVar32 = std::ostream::_M_insert<unsigned_long>((ulong)poVar32);
          std::endl<char,std::char_traits<char>>(poVar32);
          poVar32 = std::operator<<((ostream *)&std::cout,"  ");
          poVar32 = std::operator<<(poVar32,"num_threads  : ");
          poVar32 = std::ostream::_M_insert<unsigned_long>((ulong)poVar32);
          std::endl<char,std::char_traits<char>>(poVar32);
          poVar32 = std::operator<<((ostream *)&std::cout,"  ");
          poVar32 = std::operator<<(poVar32,"sigma        : ");
          poVar32 = (ostream *)std::ostream::operator<<(poVar32,(float)sigma);
          std::endl<char,std::char_traits<char>>(poVar32);
          poVar32 = std::operator<<((ostream *)&std::cout,"  ");
          poVar32 = std::operator<<(poVar32,"eta0         : ");
          poVar32 = (ostream *)std::ostream::operator<<(poVar32,(float)eta0);
          std::endl<char,std::char_traits<char>>(poVar32);
          poVar32 = std::operator<<((ostream *)&std::cout,"  ");
          poVar32 = std::operator<<(poVar32,"eta1         : ");
          poVar32 = (ostream *)std::ostream::operator<<(poVar32,(float)eta1);
          std::endl<char,std::char_traits<char>>(poVar32);
          poVar32 = std::operator<<((ostream *)&std::cout,"  ");
          poVar32 = std::operator<<(poVar32,"input_file   : ");
          poVar32 = std::operator<<(poVar32,(string *)&input_file);
          std::endl<char,std::char_traits<char>>(poVar32);
          poVar32 = std::operator<<((ostream *)&std::cout,"  ");
          poVar32 = std::operator<<(poVar32,"output_vector_file  : ");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gen,
                         &output_prefix,".<#>.tsv");
          poVar32 = std::operator<<(poVar32,(string *)&gen);
          std::endl<char,std::char_traits<char>>(poVar32);
          std::__cxx11::string::~string((string *)&gen);
          poVar32 = std::operator<<((ostream *)&std::cout,"  ");
          poVar32 = std::operator<<(poVar32,"sep          : ");
          poVar32 = std::operator<<(poVar32,"\"");
          poVar32 = std::operator<<(poVar32,cVar18);
          poVar32 = std::operator<<(poVar32,"\"");
          std::endl<char,std::char_traits<char>>(poVar32);
          poVar32 = std::operator<<((ostream *)&std::cout,"  ");
          std::operator<<(poVar32,"share        : ");
          uVar37 = -lVar22;
          for (uVar41 = 0;
              uVar41 < (ulong)((long)share.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)share.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3);
              uVar41 = uVar41 + 1) {
            if (uVar41 != 0) {
              std::operator<<((ostream *)&std::cout,",");
            }
            std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          }
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          poVar32 = std::operator<<((ostream *)&std::cout,"  ");
          poVar32 = std::operator<<(poVar32,"order        : ");
          poVar32 = std::ostream::_M_insert<unsigned_long>((ulong)poVar32);
          std::endl<char,std::char_traits<char>>(poVar32);
          poVar32 = std::operator<<((ostream *)&std::cout,"  ");
          poVar32 = std::operator<<(poVar32,"shuffle      : ");
          *(uint *)(poVar32 + *(long *)(*(long *)poVar32 + -0x18) + 0x18) =
               *(uint *)(poVar32 + *(long *)(*(long *)poVar32 + -0x18) + 0x18) | 1;
          poVar32 = std::ostream::_M_insert<bool>(SUB81(poVar32,0));
          std::endl<char,std::char_traits<char>>(poVar32);
          poVar32 = std::operator<<((ostream *)&std::cout,"  ");
          poVar32 = std::operator<<(poVar32,"sort         : ");
          *(uint *)(poVar32 + *(long *)(*(long *)poVar32 + -0x18) + 0x18) =
               *(uint *)(poVar32 + *(long *)(*(long *)poVar32 + -0x18) + 0x18) | 1;
          poVar32 = std::ostream::_M_insert<bool>(SUB81(poVar32,0));
          std::endl<char,std::char_traits<char>>(poVar32);
          codebooks.
          super__Vector_base<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          codebooks.
          super__Vector_base<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          codebooks.
          super__Vector_base<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          data.
          super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          data.
          super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          data.
          super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::seed(&gen,0);
          poVar32 = std::operator<<((ostream *)&std::cout,"load ");
          poVar32 = std::operator<<(poVar32,(string *)&input_file);
          poVar32 = std::operator<<(poVar32," ...");
          std::endl<char,std::char_traits<char>>(poVar32);
          std::
          vector<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
          ::_M_erase_at_end(&codebooks,(pointer)0x0);
          psVar38 = codebooks.
                    super__Vector_base<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          psVar13 = codebooks.
                    super__Vector_base<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar24 = (long)codebooks.
                         super__Vector_base<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)codebooks.
                         super__Vector_base<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          uVar41 = lVar24 >> 4;
          if (uVar41 < uVar37) {
            uVar34 = -lVar22 - uVar41;
            if (uVar34 != 0) {
              if ((ulong)((long)codebooks.
                                super__Vector_base<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)codebooks.
                                super__Vector_base<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish >> 4) < uVar34) {
                if ((uVar41 ^ 0x7ffffffffffffff) < uVar34) {
                  std::__throw_length_error("vector::_M_default_append");
                }
                if (uVar34 < uVar41) {
                  uVar34 = uVar41;
                }
                uVar34 = uVar34 + uVar41;
                if (0x7fffffffffffffe < uVar34) {
                  uVar34 = 0x7ffffffffffffff;
                }
                psVar25 = (pointer)operator_new(uVar34 * 0x10);
                puVar26 = (undefined8 *)((long)psVar25 + lVar24);
                for (uVar33 = uVar41; uVar37 != uVar33; uVar33 = uVar33 + 1) {
                  *puVar26 = 0;
                  puVar26[1] = 0;
                  puVar26 = puVar26 + 2;
                }
                for (lVar22 = 0;
                    psVar1 = (pointer)((long)&(psVar13->
                                              super___shared_ptr<(anonymous_namespace)::CodeBook,_(__gnu_cxx::_Lock_policy)2>
                                              )._M_ptr + lVar22), psVar1 != psVar38;
                    lVar22 = lVar22 + 0x10) {
                  peVar8 = (psVar1->
                           super___shared_ptr<(anonymous_namespace)::CodeBook,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr;
                  p_Var12 = (psVar1->
                            super___shared_ptr<(anonymous_namespace)::CodeBook,_(__gnu_cxx::_Lock_policy)2>
                            )._M_refcount._M_pi;
                  (psVar1->
                  super___shared_ptr<(anonymous_namespace)::CodeBook,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  puVar26 = (undefined8 *)
                            ((long)&(psVar25->
                                    super___shared_ptr<(anonymous_namespace)::CodeBook,_(__gnu_cxx::_Lock_policy)2>
                                    )._M_ptr + lVar22);
                  *puVar26 = peVar8;
                  puVar26[1] = p_Var12;
                  (psVar1->
                  super___shared_ptr<(anonymous_namespace)::CodeBook,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr = (element_type *)0x0;
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                            (&(psVar1->
                              super___shared_ptr<(anonymous_namespace)::CodeBook,_(__gnu_cxx::_Lock_policy)2>
                              )._M_refcount);
                }
                if (codebooks.
                    super__Vector_base<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(codebooks.
                                  super__Vector_base<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
                }
                codebooks.
                super__Vector_base<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     (pointer)((long)psVar25 + ((lVar24 + uVar41 * -0x10) - lVar39));
                codebooks.
                super__Vector_base<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = psVar25 + uVar34;
                codebooks.
                super__Vector_base<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
                ._M_impl.super__Vector_impl_data._M_start = psVar25;
              }
              else {
                for (; uVar37 != uVar41; uVar41 = uVar41 + 1) {
                  ((codebooks.
                    super__Vector_base<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish)->
                  super___shared_ptr<(anonymous_namespace)::CodeBook,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr = (element_type *)0x0;
                  ((codebooks.
                    super__Vector_base<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish)->
                  super___shared_ptr<(anonymous_namespace)::CodeBook,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  codebooks.
                  super__Vector_base<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish =
                       codebooks.
                       super__Vector_base<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish + 1;
                }
              }
            }
          }
          else if (uVar37 < uVar41) {
            std::
            vector<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
            ::_M_erase_at_end(&codebooks,
                              (pointer)((long)codebooks.
                                              super__Vector_base<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start - lVar39));
          }
          first_of_sharings_1.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
          first_of_sharings_1.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
          first_of_sharings_1.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
          first_of_sharings_1.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
          first_of_sharings_1.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
          uVar46 = 0;
          for (uVar41 = 0;
              psVar13 = codebooks.
                        super__Vector_base<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
                        ._M_impl.super__Vector_impl_data._M_start, uVar37 != uVar41;
              uVar41 = uVar41 + 1) {
            if ((share.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start ==
                 share.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish) ||
               (share.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[uVar41] == uVar46)) {
              std::vector<bool,_std::allocator<bool>_>::push_back(&first_of_sharings_1,true);
              uVar46 = uVar46 + 1;
            }
            else {
              std::vector<bool,_std::allocator<bool>_>::push_back(&first_of_sharings_1,false);
            }
          }
          this = &((codebooks.
                    super__Vector_base<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                  super___shared_ptr<(anonymous_namespace)::CodeBook,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount;
          for (sVar47 = 0; uVar37 != sVar47; sVar47 = sVar47 + 1) {
            rVar53 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               (&first_of_sharings_1,sVar47);
            if ((*rVar53._M_p & rVar53._M_mask) == 0) {
              uVar46 = share.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start[sVar47];
              ((__shared_ptr<(anonymous_namespace)::CodeBook,_(__gnu_cxx::_Lock_policy)2> *)
              (this + -1))->_M_ptr =
                   psVar13[uVar46].
                   super___shared_ptr<(anonymous_namespace)::CodeBook,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                        (this,&psVar13[uVar46].
                               super___shared_ptr<(anonymous_namespace)::CodeBook,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount);
            }
            else {
              cv.num_entries_.
              super__Vector_base<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)operator_new(0x78);
              help_message._M_dataplus._M_p = (pointer)&first_of_sharings;
              ((cv.num_entries_.
                super__Vector_base<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_finish)->
              super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x100000001;
              ((cv.num_entries_.
                super__Vector_base<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_finish)->
              super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
                   (element_type *)&PTR___Sp_counted_ptr_inplace_00122ba0;
              cv.num_entries_.
              super__Vector_base<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   cv.num_entries_.
                   super__Vector_base<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
              cv.num_entries_.
              super__Vector_base<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[4].
              super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              cv.num_entries_.
              super__Vector_base<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[4].
              super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              cv.num_entries_.
              super__Vector_base<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[1].
              super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              cv.num_entries_.
              super__Vector_base<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[1].
              super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              cv.num_entries_.
              super__Vector_base<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[6].
              super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              cv.num_entries_.
              super__Vector_base<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[2].
              super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              cv.num_entries_.
              super__Vector_base<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[2].
              super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              cv.num_entries_.
              super__Vector_base<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[3].
              super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              cv.num_entries_.
              super__Vector_base<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[3].
              super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              cv.num_entries_.
              super__Vector_base<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[4].
              super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)
                   (cv.num_entries_.
                    super__Vector_base<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish + 7);
              cv.num_entries_.
              super__Vector_base<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[4].
              super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
              cv.num_entries_.
              super__Vector_base<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[5].
              super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              cv.num_entries_.
              super__Vector_base<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[5].
              super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              help_message._M_string_length = 0;
              *(undefined4 *)
               &cv.num_entries_.
                super__Vector_base<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_finish[6].
                super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_ptr = 0x3f800000;
              cv.num_entries_.
              super__Vector_base<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[6].
              super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              cv.num_entries_.
              super__Vector_base<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[7].
              super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)0x0;
              std::
              __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<(anonymous_namespace)::CodeBook,_std::allocator<(anonymous_namespace)::CodeBook>,_(__gnu_cxx::_Lock_policy)2>_>_>
              ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<(anonymous_namespace)::CodeBook,_std::allocator<(anonymous_namespace)::CodeBook>,_(__gnu_cxx::_Lock_policy)2>_>_>
                                  *)&help_message);
              psVar15 = cv.num_entries_.
                        super__Vector_base<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              psVar14 = cv.num_entries_.
                        super__Vector_base<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              cv.num_entries_.
              super__Vector_base<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              cv.num_entries_.
              super__Vector_base<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              help_message._M_dataplus._M_p =
                   (pointer)((__shared_ptr<(anonymous_namespace)::CodeBook,_(__gnu_cxx::_Lock_policy)2>
                              *)(this + -1))->_M_ptr;
              help_message._M_string_length = (size_type)this->_M_pi;
              ((__shared_ptr<(anonymous_namespace)::CodeBook,_(__gnu_cxx::_Lock_policy)2> *)
              (this + -1))->_M_ptr = (element_type *)psVar14;
              this->_M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)psVar15;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                         &help_message._M_string_length);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                         &cv.num_entries_.
                          super__Vector_base<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
            }
            this = this + 2;
          }
          std::ifstream::ifstream(&help_message,input_file._M_dataplus._M_p,_S_in);
          if (*(int *)((long)aiStack_15a0 + *(long *)(help_message._M_dataplus._M_p + -0x18)) == 0)
          {
            line._M_dataplus._M_p = (pointer)&line.field_2;
            line._M_string_length = 0;
            line.field_2._M_local_buf[0] = '\0';
            local_1828 = 0;
            while( true ) {
              piVar23 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                  ((istream *)&help_message,(string *)&line);
              if (((byte)piVar23[*(long *)(*(long *)piVar23 + -0x18) + 0x20] & 5) != 0) break;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        (&instance,uVar37,(allocator_type *)&cv);
              local_1828 = local_1828 + 1;
              uVar41 = 1;
              psVar38 = psVar13;
              do {
                uVar34 = std::__cxx11::string::find((char)&line,(ulong)uVar21);
                peVar8 = (psVar38->
                         super___shared_ptr<(anonymous_namespace)::CodeBook,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr;
                std::__cxx11::string::substr((ulong)&first_of_sharings,(ulong)&line);
                _Var27._M_cur =
                     (__node_type *)
                     std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find(&(peVar8->entry2codes_)._M_h,(key_type *)&first_of_sharings);
                if (_Var27._M_cur == (__node_type *)0x0) {
                  pbVar2 = (peVar8->code2entries_).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  pbVar3 = (peVar8->code2entries_).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                  std::__cxx11::string::string((string *)&cv,(string *)&first_of_sharings);
                  cv.neg_size_ = (long)pbVar3 - (long)pbVar2 >> 5;
                  pVar54 = std::
                           _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                           ::_M_emplace<std::pair<std::__cxx11::string,unsigned_long>>
                                     ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                                       *)&peVar8->entry2codes_,&cv);
                  _Var27._M_cur =
                       (__node_type *)
                       pVar54.first.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                       ._M_cur;
                  std::__cxx11::string::~string((string *)&cv);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back(&peVar8->code2entries_,(key_type *)&first_of_sharings);
                  cv.num_entries_.
                  super__Vector_base<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                  std::vector<double,_std::allocator<double>_>::emplace_back<double>
                            (&peVar8->counts_,(double *)&cv);
                }
                uVar46 = *(unsigned_long *)
                          ((long)&((_Var27._M_cur)->
                                  super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                  ).
                                  super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
                                  ._M_storage._M_storage + 0x20);
                pdVar4 = (peVar8->counts_).super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start;
                pdVar4[uVar46] = pdVar4[uVar46] + 1.0;
                std::__cxx11::string::~string((string *)&first_of_sharings);
                instance.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[uVar41 - 1] = uVar46;
                if (uVar37 < uVar41) {
                  poVar32 = std::operator<<((ostream *)&std::cerr,"too many entries in a line: ");
                  poVar32 = std::operator<<(poVar32,(string *)&line);
                  std::endl<char,std::char_traits<char>>(poVar32);
                  goto LAB_00113d9e;
                }
                uVar41 = uVar41 + 1;
                psVar38 = psVar38 + 1;
              } while (uVar34 < 0xfffffffffffffffe);
              if (bVar17 == false) {
                std::
                vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ::push_back(&data,(value_type *)
                                  &instance.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                           );
              }
              std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                        (&instance.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                        );
            }
            if (bVar17 != false) {
              poVar32 = std::operator<<((ostream *)&std::cout,"reindex ...");
              std::endl<char,std::char_traits<char>>(poVar32);
              sVar47 = 0;
              while( true ) {
                if (uVar37 == sVar47) break;
                rVar53 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                   (&first_of_sharings_1,sVar47);
                if ((*rVar53._M_p & rVar53._M_mask) != 0) {
                  peVar8 = psVar13[sVar47].
                           super___shared_ptr<(anonymous_namespace)::CodeBook,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr;
                  std::
                  vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
                  ::vector((vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
                            *)&instance,
                           (long)(peVar8->counts_).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                           (long)(peVar8->counts_).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start >> 3,(allocator_type *)&cv);
                  std::vector<double,_std::allocator<double>_>::vector
                            ((vector<double,_std::allocator<double>_> *)&probs,
                             (long)(peVar8->counts_).
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                             (long)(peVar8->counts_).
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start >> 3,(allocator_type *)&cv);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::vector(&new_code2entries,
                           (long)(peVar8->counts_).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_finish -
                           (long)(peVar8->counts_).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start >> 3,(allocator_type *)&cv);
                  cv.num_entries_.
                  super__Vector_base<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)&cv.chopout_enabled_;
                  cv.num_entries_.
                  super__Vector_base<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x1;
                  cv.num_entries_.
                  super__Vector_base<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  cv.dim_ = 0;
                  cv.neg_size_ = CONCAT44(cv.neg_size_._4_4_,0x3f800000);
                  cv.eta0_ = 0.0;
                  cv.eta1_ = 0.0;
                  cv.chopout_enabled_ = false;
                  cv._49_7_ = 0;
                  pdVar4 = (peVar8->counts_).super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start;
                  pdVar5 = (peVar8->counts_).super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_finish;
                  puVar35 = instance.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start + 1;
                  for (uVar46 = 0; (long)pdVar5 - (long)pdVar4 >> 3 != uVar46; uVar46 = uVar46 + 1)
                  {
                    puVar35[-1] = (unsigned_long)pdVar4[uVar46];
                    *puVar35 = uVar46;
                    puVar35 = puVar35 + 2;
                  }
                  std::
                  __sort<__gnu_cxx::__normal_iterator<std::pair<double,unsigned_long>*,std::vector<std::pair<double,unsigned_long>,std::allocator<std::pair<double,unsigned_long>>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<std::pair<double,unsigned_long>>>>
                            (instance.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start,
                             instance.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish);
                  lVar39 = (long)instance.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)instance.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start;
                  lVar22 = 8;
                  lVar24 = 0;
                  for (puVar48 = (_Bit_pointer)0x0; (_Bit_pointer)(lVar39 >> 4) != puVar48;
                      puVar48 = (_Bit_pointer)((long)puVar48 + 1)) {
                    lVar42 = *(long *)((long)instance.
                                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                             ._M_impl.super__Vector_impl_data._M_start + lVar22);
                    pbVar2 = (peVar8->code2entries_).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    (&((probs.
                        super__Vector_base<std::shared_ptr<std::discrete_distribution<int>_>,_std::allocator<std::shared_ptr<std::discrete_distribution<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super___shared_ptr<std::discrete_distribution<int>,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr)[(long)puVar48] =
                         *(element_type **)
                          ((long)instance.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start + lVar22 + -8);
                    std::__cxx11::string::_M_assign
                              ((string *)
                               ((long)&((new_code2entries.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                       _M_p + lVar24));
                    std::__cxx11::string::string
                              ((string *)&first_of_sharings,(string *)(pbVar2 + lVar42));
                    first_of_sharings.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_end_of_storage = puVar48;
                    std::
                    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    ::_M_emplace<std::pair<std::__cxx11::string,unsigned_long>>
                              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                                *)&cv,(string *)&first_of_sharings);
                    std::__cxx11::string::~string((string *)&first_of_sharings);
                    lVar24 = lVar24 + 0x20;
                    lVar22 = lVar22 + 0x10;
                  }
                  std::vector<double,_std::allocator<double>_>::operator=
                            (&peVar8->counts_,(vector<double,_std::allocator<double>_> *)&probs);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator=(&peVar8->code2entries_,&new_code2entries);
                  std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::operator=(&(peVar8->entry2codes_)._M_h,
                              (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                               *)&cv);
                  std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                 *)&cv);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&new_code2entries);
                  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                            ((_Vector_base<double,_std::allocator<double>_> *)&probs);
                  std::
                  _Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
                  ::~_Vector_base((_Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
                                   *)&instance);
                }
                sVar47 = sVar47 + 1;
              }
              poVar32 = std::operator<<((ostream *)&std::cout,"remake data ...");
              std::endl<char,std::char_traits<char>>(poVar32);
              lVar22 = ((long)data.
                              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)data.
                             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x18;
              std::
              vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ::resize(&data,local_1828 + lVar22);
              std::ios::clear((int)&help_message +
                              (int)*(undefined8 *)(help_message._M_dataplus._M_p + -0x18));
              std::istream::seekg((long)&help_message,_S_beg);
              while( true ) {
                piVar23 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                    ((istream *)&help_message,(string *)&line);
                if (((byte)piVar23[*(long *)(*(long *)piVar23 + -0x18) + 0x20] & 5) != 0) break;
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           &first_of_sharings,uVar37,(allocator_type *)&cv);
                lVar39 = 0;
                do {
                  uVar41 = std::__cxx11::string::find((char)&line,(ulong)uVar21);
                  lVar24 = *(long *)((long)&(psVar13->
                                            super___shared_ptr<(anonymous_namespace)::CodeBook,_(__gnu_cxx::_Lock_policy)2>
                                            )._M_ptr + lVar39 * 2);
                  std::__cxx11::string::substr((ulong)&cv,(ulong)&line);
                  pmVar28 = std::__detail::
                            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)(lVar24 + 0x30),(key_type *)&cv);
                  mVar6 = *pmVar28;
                  std::__cxx11::string::~string((string *)&cv);
                  *(mapped_type *)
                   ((long)first_of_sharings.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + lVar39)
                       = mVar6;
                  lVar39 = lVar39 + 8;
                } while (uVar41 < 0xfffffffffffffffe);
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                          (data.
                           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar22,
                           (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           &first_of_sharings);
                lVar22 = lVar22 + 1;
                std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                          ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                           &first_of_sharings);
              }
            }
            std::__cxx11::string::~string((string *)&line);
          }
          else {
            poVar32 = std::operator<<((ostream *)&std::cerr,"cannot open file: ");
            poVar32 = std::operator<<(poVar32,(string *)&input_file);
            std::endl<char,std::char_traits<char>>(poVar32);
          }
          std::ifstream::~ifstream(&help_message);
          std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                    (&first_of_sharings_1.super__Bvector_base<std::allocator<bool>_>);
          poVar32 = std::operator<<((ostream *)&std::cout,"data size: ");
          poVar32 = std::ostream::_M_insert<unsigned_long>((ulong)poVar32);
          std::endl<char,std::char_traits<char>>(poVar32);
          poVar32 = std::operator<<((ostream *)&std::cout,"codebook sizes:");
          std::endl<char,std::char_traits<char>>(poVar32);
          for (uVar41 = 0; uVar37 != uVar41; uVar41 = uVar41 + 1) {
            poVar32 = std::operator<<((ostream *)&std::cout,"  ");
            poVar32 = std::ostream::_M_insert<unsigned_long>((ulong)poVar32);
            poVar32 = std::operator<<(poVar32,": ");
            poVar32 = std::ostream::_M_insert<unsigned_long>((ulong)poVar32);
            std::endl<char,std::char_traits<char>>(poVar32);
          }
          poVar32 = std::operator<<((ostream *)&std::cout,"creat distributions ...");
          std::endl<char,std::char_traits<char>>(poVar32);
          probs.
          super__Vector_base<std::shared_ptr<std::discrete_distribution<int>_>,_std::allocator<std::shared_ptr<std::discrete_distribution<int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          first_of_sharings.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
          first_of_sharings.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
          first_of_sharings.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
          first_of_sharings.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
          first_of_sharings.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
          probs.
          super__Vector_base<std::shared_ptr<std::discrete_distribution<int>_>,_std::allocator<std::shared_ptr<std::discrete_distribution<int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          probs.
          super__Vector_base<std::shared_ptr<std::discrete_distribution<int>_>,_std::allocator<std::shared_ptr<std::discrete_distribution<int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          sVar47 = (long)codebooks.
                         super__Vector_base<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)psVar13 >> 4;
          uVar46 = 0;
          for (sVar49 = 0; sVar47 != sVar49; sVar49 = sVar49 + 1) {
            if ((share.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start ==
                 share.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish) ||
               (share.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[sVar49] == uVar46)) {
              std::vector<bool,_std::allocator<bool>_>::push_back(&first_of_sharings,true);
              uVar46 = uVar46 + 1;
            }
            else {
              std::vector<bool,_std::allocator<bool>_>::push_back(&first_of_sharings,false);
            }
          }
          psVar38 = psVar13;
          for (sVar49 = 0; sVar47 != sVar49; sVar49 = sVar49 + 1) {
            rVar53 = std::vector<bool,_std::allocator<bool>_>::operator[](&first_of_sharings,sVar49)
            ;
            if ((*rVar53._M_p & rVar53._M_mask) == 0) {
              std::
              vector<std::shared_ptr<std::discrete_distribution<int>_>,_std::allocator<std::shared_ptr<std::discrete_distribution<int>_>_>_>
              ::push_back(&probs,probs.
                                 super__Vector_base<std::shared_ptr<std::discrete_distribution<int>_>,_std::allocator<std::shared_ptr<std::discrete_distribution<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start +
                                 share.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start[sVar49]);
            }
            else {
              cv.num_entries_.
              super__Vector_base<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (pointer)(((psVar38->
                              super___shared_ptr<(anonymous_namespace)::CodeBook,_(__gnu_cxx::_Lock_policy)2>
                              )._M_ptr)->counts_).
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start;
              first_of_sharings_1.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
                   (_Bit_type *)
                   (((psVar38->
                     super___shared_ptr<(anonymous_namespace)::CodeBook,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr)->counts_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_finish;
              std::
              make_shared<std::discrete_distribution<int>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>>
                        ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                          *)&help_message,
                         (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>
                          *)&cv);
              std::
              vector<std::shared_ptr<std::discrete_distribution<int>>,std::allocator<std::shared_ptr<std::discrete_distribution<int>>>>
              ::emplace_back<std::shared_ptr<std::discrete_distribution<int>>>
                        ((vector<std::shared_ptr<std::discrete_distribution<int>>,std::allocator<std::shared_ptr<std::discrete_distribution<int>>>>
                          *)&probs,(shared_ptr<std::discrete_distribution<int>_> *)&help_message);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                         &help_message._M_string_length);
            }
            psVar38 = psVar38 + 1;
          }
          poVar32 = std::operator<<((ostream *)&std::cout,"initialize covec ...");
          std::endl<char,std::char_traits<char>>(poVar32);
          covec::Covec<float>::
          Covec<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                    (&cv,&probs,&gen,dim,(float)sigma,neg_size,(float)eta0,(float)eta1,bVar20,&share
                    );
          poVar32 = std::operator<<((ostream *)&std::cout,"start training ...");
          std::endl<char,std::char_traits<char>>(poVar32);
          lVar22 = std::chrono::_V2::system_clock::now();
          local_1850 = 0;
          lVar39 = 0;
          local_1828 = lVar22;
          while (local_1850 != uVar16) {
            rVar29 = std::
                     mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                     ::operator()(&gen);
            srand((uint)rVar29);
            if (bVar19 != false) {
              std::
              random_shuffle<__gnu_cxx::__normal_iterator<std::vector<unsigned_long,std::allocator<unsigned_long>>*,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>
                        ((__normal_iterator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                          )data.
                           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                         (__normal_iterator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                          )data.
                           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
            }
            local_1850 = local_1850 + 1;
            uVar37 = 0;
            while( true ) {
              uVar41 = ((long)data.
                              super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)data.
                             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x18;
              if (uVar41 <= uVar37) break;
              uVar34 = uVar37 + 1000000;
              if (uVar34 <= uVar41) {
                uVar41 = uVar34;
              }
              uVar30 = (uVar41 - uVar37) / (ulong)__n;
              std::vector<std::thread,_std::allocator<std::thread>_>::vector
                        ((vector<std::thread,_std::allocator<std::thread>_> *)&help_message,__n,
                         (allocator_type *)&first_of_sharings_1);
              lVar42 = 0;
              lVar24 = 0;
              for (uVar33 = 1; uVar44 = __n, uVar33 - __n != 1; uVar33 = uVar33 + 1) {
                lVar31 = lVar24 * uVar30;
                if (uVar33 < (ulong)__n) {
                  line._M_dataplus._M_p =
                       (pointer)(anonymous_namespace)::
                                run_thread<float,__gnu_cxx::__normal_iterator<std::vector<unsigned_long,std::allocator<unsigned_long>>const*,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                  ;
                  instance.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start = (pointer)&cv;
                  new_code2entries.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start =
                       (pointer)(data.
                                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + uVar37 + lVar31);
                  local_17a8._M_current =
                       data.
                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar37 + (lVar24 + 1) * uVar30;
                  local_17b0._M_data = &gen;
                  std::thread::
                  thread<void(*)(covec::Covec<float>&,__gnu_cxx::__normal_iterator<std::vector<unsigned_long,std::allocator<unsigned_long>>const*,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,__gnu_cxx::__normal_iterator<std::vector<unsigned_long,std::allocator<unsigned_long>>const*,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,unsigned_long,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&),std::reference_wrapper<covec::Covec<float>>,__gnu_cxx::__normal_iterator<std::vector<unsigned_long,std::allocator<unsigned_long>>const*,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,__gnu_cxx::__normal_iterator<std::vector<unsigned_long,std::allocator<unsigned_long>>const*,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,unsigned_long_const&,std::reference_wrapper<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>,void>
                            ((thread *)&first_of_sharings_1,
                             (_func_void_Covec<float>_ptr___normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_ptr,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>___normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_ptr,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_unsigned_long_mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_ptr
                              **)&line,(reference_wrapper<covec::Covec<float>_> *)&instance,
                             (__normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                              *)&new_code2entries,&local_17a8,&batch_size,&local_17b0);
                }
                else {
                  line._M_dataplus._M_p =
                       (pointer)(anonymous_namespace)::
                                run_thread<float,__gnu_cxx::__normal_iterator<std::vector<unsigned_long,std::allocator<unsigned_long>>const*,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                  ;
                  instance.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start = (pointer)&cv;
                  new_code2entries.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start =
                       (pointer)(data.
                                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + uVar37 + lVar31);
                  local_17a8._M_current =
                       data.
                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar41;
                  local_17b0._M_data = &gen;
                  std::thread::
                  thread<void(*)(covec::Covec<float>&,__gnu_cxx::__normal_iterator<std::vector<unsigned_long,std::allocator<unsigned_long>>const*,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,__gnu_cxx::__normal_iterator<std::vector<unsigned_long,std::allocator<unsigned_long>>const*,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,unsigned_long,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&),std::reference_wrapper<covec::Covec<float>>,__gnu_cxx::__normal_iterator<std::vector<unsigned_long,std::allocator<unsigned_long>>const*,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,__gnu_cxx::__normal_iterator<std::vector<unsigned_long,std::allocator<unsigned_long>>const*,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,unsigned_long_const&,std::reference_wrapper<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>,void>
                            ((thread *)&first_of_sharings_1,
                             (_func_void_Covec<float>_ptr___normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_ptr,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>___normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_ptr,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_unsigned_long_mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_ptr
                              **)&line,(reference_wrapper<covec::Covec<float>_> *)&instance,
                             (__normal_iterator<const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_*,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                              *)&new_code2entries,&local_17a8,&batch_size,&local_17b0);
                }
                std::thread::operator=
                          ((thread *)(help_message._M_dataplus._M_p + lVar42),
                           (thread *)&first_of_sharings_1);
                std::thread::~thread((thread *)&first_of_sharings_1);
                lVar42 = lVar42 + 8;
                lVar24 = lVar24 + 1;
              }
              while (uVar44 != 0) {
                std::thread::join();
                uVar44 = uVar44 - 1;
              }
              lVar39 = lVar39 + (uVar41 - uVar37);
              lVar24 = std::chrono::_V2::system_clock::now();
              auVar51._8_4_ = (int)((ulong)lVar39 >> 0x20);
              auVar51._0_8_ = lVar39;
              auVar51._12_4_ = 0x45300000;
              lVar42 = (long)data.
                             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)data.
                             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
              if (999999 < lVar24 - local_1828) {
                poVar32 = std::operator<<((ostream *)&std::cout,"\r");
                poVar32 = std::operator<<(poVar32,"epoch ");
                lVar24 = *(long *)poVar32;
                lVar31 = *(long *)(lVar24 + -0x18);
                *(uint *)(poVar32 + lVar31 + 0x18) =
                     *(uint *)(poVar32 + lVar31 + 0x18) & 0xffffff4f | 0x80;
                *(undefined8 *)(poVar32 + *(long *)(lVar24 + -0x18) + 0x10) = 3;
                poVar32 = std::ostream::_M_insert<unsigned_long>((ulong)poVar32);
                poVar32 = std::operator<<(poVar32,"/");
                poVar32 = std::ostream::_M_insert<unsigned_long>((ulong)poVar32);
                poVar32 = std::operator<<(poVar32,"  ");
                lVar42 = (lVar42 / 0x18) * uVar16;
                auVar52._8_4_ = (int)((ulong)lVar42 >> 0x20);
                auVar52._0_8_ = lVar42;
                auVar52._12_4_ = 0x45300000;
                lVar24 = *(long *)poVar32;
                *(uint *)(poVar32 + *(long *)(lVar24 + -0x18) + 0x18) =
                     *(uint *)(poVar32 + *(long *)(lVar24 + -0x18) + 0x18) & 0xffffff4f | 0x20;
                *(undefined8 *)(poVar32 + *(long *)(lVar24 + -0x18) + 0x10) = 5;
                *(uint *)(poVar32 + *(long *)(lVar24 + -0x18) + 0x18) =
                     *(uint *)(poVar32 + *(long *)(lVar24 + -0x18) + 0x18) & 0xfffffefb | 4;
                *(undefined8 *)(poVar32 + *(long *)(lVar24 + -0x18) + 8) = 2;
                poVar32 = std::ostream::_M_insert<double>
                                    ((((auVar51._8_8_ - 1.9342813113834067e+25) +
                                      ((double)CONCAT44(0x43300000,(int)lVar39) - 4503599627370496.0
                                      )) * 100.0) /
                                     ((auVar52._8_8_ - 1.9342813113834067e+25) +
                                     ((double)CONCAT44(0x43300000,(int)lVar42) - 4503599627370496.0)
                                     ));
                poVar32 = std::operator<<(poVar32," %");
                poVar32 = std::operator<<(poVar32,"  ");
                lVar24 = *(long *)poVar32;
                lVar42 = *(long *)(lVar24 + -0x18);
                *(uint *)(poVar32 + lVar42 + 0x18) =
                     *(uint *)(poVar32 + lVar42 + 0x18) & 0xffffff4f | 0x20;
                *(undefined8 *)(poVar32 + *(long *)(lVar24 + -0x18) + 0x10) = 6;
                poVar32 = std::ostream::_M_insert<unsigned_long>((ulong)poVar32);
                std::operator<<(poVar32," words/sec.");
                std::ostream::flush();
                local_1828 = std::chrono::_V2::system_clock::now();
              }
              std::vector<std::thread,_std::allocator<std::thread>_>::~vector
                        ((vector<std::thread,_std::allocator<std::thread>_> *)&help_message);
              uVar37 = uVar34;
            }
          }
          lVar39 = std::chrono::_V2::system_clock::now();
          if (999999 < lVar39 - lVar22) {
            poVar32 = std::operator<<((ostream *)&std::cout,"\r");
            poVar32 = std::operator<<(poVar32,"average: ");
            lVar22 = *(long *)poVar32;
            lVar39 = *(long *)(lVar22 + -0x18);
            *(uint *)(poVar32 + lVar39 + 0x18) =
                 *(uint *)(poVar32 + lVar39 + 0x18) & 0xffffff4f | 0x20;
            *(undefined8 *)(poVar32 + *(long *)(lVar22 + -0x18) + 0x10) = 6;
            poVar32 = std::ostream::_M_insert<unsigned_long>((ulong)poVar32);
            poVar32 = std::operator<<(poVar32," words/sec.");
            std::endl<char,std::char_traits<char>>(poVar32);
          }
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          poVar32 = std::operator<<((ostream *)&std::cout,"save ...");
          std::endl<char,std::char_traits<char>>(poVar32);
          lVar22 = (long)cv.num_entries_.
                         super__Vector_base<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)cv.num_entries_.
                         super__Vector_base<std::shared_ptr<unsigned_long>,_std::allocator<std::shared_ptr<unsigned_long>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          uVar46 = 0;
          while( true ) {
            if (uVar46 == lVar22 >> 4) {
              covec::Covec<float>::~Covec(&cv);
              std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                        (&first_of_sharings.super__Bvector_base<std::allocator<bool>_>);
              std::
              vector<std::shared_ptr<std::discrete_distribution<int>_>,_std::allocator<std::shared_ptr<std::discrete_distribution<int>_>_>_>
              ::~vector(&probs);
              std::
              vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              ::~vector(&data);
              std::
              vector<std::shared_ptr<(anonymous_namespace)::CodeBook>,_std::allocator<std::shared_ptr<(anonymous_namespace)::CodeBook>_>_>
              ::~vector(&codebooks);
              std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                        (&share.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
              std::__cxx11::string::~string((string *)&share_str);
              std::__cxx11::string::~string((string *)&output_prefix);
              std::__cxx11::string::~string((string *)&input_file);
              anon_unknown.dwarf_22e74::Config::~Config((Config *)local_16b0);
              return 0;
            }
            std::operator+(&line,&output_prefix,".");
            std::__cxx11::to_string((string *)&instance,uVar46);
            std::operator+(&help_message,&line,(string *)&instance);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &first_of_sharings_1,&help_message,".tsv");
            std::__cxx11::string::~string((string *)&help_message);
            std::__cxx11::string::~string((string *)&instance);
            std::__cxx11::string::~string((string *)&line);
            std::ofstream::ofstream
                      (&help_message,
                       (char *)first_of_sharings_1.super__Bvector_base<std::allocator<bool>_>.
                               _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base.
                               _M_p,_S_out);
            if (*(int *)((long)aiStack_15a0 + *(long *)(help_message._M_dataplus._M_p + -0x18)) != 0
               ) break;
            peVar7 = cv.vs_.
                     super__Vector_base<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>,_std::allocator<std::shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar46].
                     super___shared_ptr<std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
            peVar8 = psVar13[uVar46].
                     super___shared_ptr<(anonymous_namespace)::CodeBook,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
            pvVar9 = (peVar7->
                     super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
            pvVar10 = (peVar7->
                      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            for (lVar39 = 0; lVar39 != ((long)pvVar9 - (long)pvVar10) / 0x18; lVar39 = lVar39 + 1) {
              pvVar43 = (peVar7->
                        super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + lVar39;
              poVar32 = std::operator<<((ostream *)&help_message,
                                        (string *)
                                        ((peVar8->code2entries_).
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start + lVar39));
              std::operator<<(poVar32,"\t");
              std::ostream::_M_insert<double>
                        (*(double *)
                          ((long)(peVar8->counts_).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start + lVar39 * 8));
              pfVar11 = *(pointer *)
                         ((long)&pvVar43->super__Vector_base<float,_std::allocator<float>_> + 8);
              lVar24 = *(long *)&pvVar43->super__Vector_base<float,_std::allocator<float>_>;
              for (lVar42 = 0; (long)pfVar11 - lVar24 >> 2 != lVar42; lVar42 = lVar42 + 1) {
                poVar32 = std::operator<<((ostream *)&help_message,"\t");
                std::ostream::operator<<
                          (poVar32,*(float *)(*(long *)&pvVar43->
                                                  super__Vector_base<float,_std::allocator<float>_>
                                             + lVar42 * 4));
              }
              std::operator<<((ostream *)&help_message,"\n");
            }
            std::ofstream::~ofstream(&help_message);
            std::__cxx11::string::~string((string *)&first_of_sharings_1);
            uVar46 = uVar46 + 1;
          }
          poVar32 = std::operator<<((ostream *)&std::cerr,"cannot open output_vector_file: ");
          poVar32 = std::operator<<(poVar32,(string *)&first_of_sharings_1);
          std::endl<char,std::char_traits<char>>(poVar32);
        }
      }
      else {
        poVar32 = std::operator<<((ostream *)&std::cerr,"cannot read a line from input file : ");
        poVar32 = std::operator<<(poVar32,(string *)&input_file);
        std::endl<char,std::char_traits<char>>(poVar32);
      }
    }
    else {
      poVar32 = std::operator<<((ostream *)&std::cerr,"input file cannot open : ");
      poVar32 = std::operator<<(poVar32,(string *)&input_file);
      std::endl<char,std::char_traits<char>>(poVar32);
    }
  }
  else {
    poVar32 = std::operator<<((ostream *)&std::cerr,"input_file required");
    std::endl<char,std::char_traits<char>>(poVar32);
    poVar32 = std::operator<<((ostream *)&std::cout,(string *)&help_message);
    std::endl<char,std::char_traits<char>>(poVar32);
  }
LAB_00113d9e:
  exit(1);
}

Assistant:

int main(int narg, const char** argv)
{
  const auto& config = parse_args(narg, argv);

  const std::size_t dim = config.dim;
  const std::size_t batch_size = config.batch_size;
  const std::size_t num_epochs = config.num_epochs;
  const std::size_t neg_size = config.neg_size;
  const std::size_t num_threads = config.num_threads;
  const Real sigma = config.sigma;
  const Real eta0 = config.eta0;
  const Real eta1 = config.eta1;
  const bool enable_chopout = config.enable_chopout;
  const std::string input_file = config.input_file;
  const std::string output_prefix = config.output_prefix;
  const char sep = config.sep;
  const std::string share_str = config.share_str;
  const std::vector<std::size_t> share = parse_share_str(share_str);
  const std::size_t order = detect_order(input_file, sep);
  const bool shuffle_enabled = config.shuffle_enabled;
  const bool sort_enabled = config.sort_enabled;

  std::cout << "config:" << std::endl;
  std::cout << "  " <<  "dim          : " << dim << std::endl;
  std::cout << "  " <<  "batch_size   : " << batch_size << std::endl;
  std::cout << "  " <<  "num_epochs   : " << num_epochs << std::endl;
  std::cout << "  " <<  "neg_size     : " << neg_size << std::endl;
  std::cout << "  " <<  "num_threads  : " << num_threads << std::endl;  
  std::cout << "  " <<  "sigma        : " << sigma << std::endl;
  std::cout << "  " <<  "eta0         : " << eta0 << std::endl;
  std::cout << "  " <<  "eta1         : " << eta1 << std::endl;
  std::cout << "  " <<  "input_file   : " << input_file << std::endl;
  std::cout << "  " <<  "output_vector_file  : " << output_prefix + ".<#>.tsv" << std::endl;
  std::cout << "  " <<  "sep          : " << "\"" << sep << "\"" << std::endl;
  
  std::cout << "  " <<  "share        : ";
  for(int i = 0; i < share.size(); ++i){
    if(i > 0){
      std::cout << ",";
    }
    std::cout << share[i];
  }
  std::cout << std::endl;
  
  std::cout << "  " <<  "order        : " << order << std::endl;
  std::cout << "  " <<  "shuffle      : " << std::boolalpha << shuffle_enabled << std::endl;
  std::cout << "  " <<  "sort         : " << std::boolalpha << sort_enabled << std::endl;

  std::vector<std::shared_ptr<CodeBook> > codebooks;
  std::vector<std::vector<std::size_t> > data;
  std::mt19937 gen(0);
  std::cout << "load " << input_file << " ..." << std::endl;;
  load(codebooks, data, input_file, order, sep, sort_enabled, share);
  std::cout << "data size: " << data.size() << std::endl;
  std::cout << "codebook sizes:" << std::endl;
  for(std::size_t i=0; i<order; ++i){
    std::cout << "  " << i << ": " << codebooks[i]->size() << std::endl;
  }

  std::cout << "creat distributions ..." << std::endl;
  std::vector<std::shared_ptr<std::discrete_distribution<int> > > probs;

  std::vector<bool> first_of_sharings;
  std::size_t counter=0;
  for(std::size_t i=0; i < codebooks.size(); ++i){
    if(share.empty() || share[i] == counter){
      first_of_sharings.push_back(true);
      ++counter;      
    }else{
      first_of_sharings.push_back(false);
    }
  }
  
  for(std::size_t i=0; i < codebooks.size(); ++i){
    if(!first_of_sharings[i]){
      probs.push_back(probs[share[i]]);
    }else{
      probs.push_back( std::make_shared<std::discrete_distribution<int> >
                       (codebooks[i]->counts().begin(), codebooks[i]->counts().end())
                       );
    }
  }
  
  std::cout << "initialize covec ..." << std::endl;
  Covec<Real> cv(probs, gen, dim, sigma, neg_size, eta0, eta1, enable_chopout, share);

  std::cout << "start training ..." << std::endl;
  std::size_t cum_count = 0, every_count = 1000000;
  auto tick = std::chrono::system_clock::now();
  auto start = tick;
  for(std::size_t epoch=0; epoch<num_epochs; ++epoch){
    std::srand(gen());
    if(shuffle_enabled){ std::random_shuffle(data.begin(), data.end()); }

    for(std::size_t m = 0; m < data.size(); m += every_count){

      std::size_t count = std::min(m + every_count, data.size()) - m; // the number of data in this round
      
      std::size_t step = count / num_threads; // data / thread

      // multi thread update
      std::vector<std::thread> threads(num_threads);
      for(std::size_t n=0; n < num_threads; ++n){
        if(n + 1 < num_threads){
          threads[n] = std::thread(&::run_thread<Real,
                                   std::vector<std::vector<std::size_t> >::const_iterator,
                                   std::mt19937
                                   >,
                                   std::ref(cv),
                                   data.cbegin() + m + n * step,
                                   data.cbegin() + m + (n+1) * step,
                                   batch_size,
                                   std::ref(gen));
          assert( m + (n+1) * step <= data.size() );
        }else{
          threads[n] = std::thread(&::run_thread<Real,
                                   std::vector<std::vector<std::size_t> >::const_iterator,
                                   std::mt19937
                                   >,
                                   std::ref(cv),
                                   data.cbegin() + m + n * step,
                                   data.cbegin() + m + count,
                                   batch_size,
                                   std::ref(gen));
          assert( std::min(m + every_count, data.size()) <= data.size() );	  
        }
      }
      for(std::size_t n=0; n < num_threads; ++n){
        threads[n].join();
      }
      
      cum_count += count;
      
      // report
      auto tack = std::chrono::system_clock::now();
      auto millisec = std::chrono::duration_cast<std::chrono::milliseconds>(tack - tick).count();
      double percent = (cum_count * 100.0) / (data.size() * num_epochs);
      if(millisec>0){
        std::size_t words_per_sec = (millisec != 0)? (1000*count) / millisec : std::numeric_limits<std::size_t>::max();
        std::cout << "\r"
                  << "epoch " << std::right << std::setw(3) << epoch+1 << "/" << num_epochs
                  << "  " << std::left << std::setw(5) << std::fixed << std::setprecision(2) << percent << " %"
                  << "  " << std::left << std::setw(6) << words_per_sec << " words/sec."
                  << std::flush;
        tick = std::chrono::system_clock::now();
      }
    }
  }

  auto tack = std::chrono::system_clock::now();
  auto millisec = std::chrono::duration_cast<std::chrono::milliseconds>(tack - start).count();
  if(millisec > 0){
    std::size_t words_per_sec = (1000 * data.size() * num_epochs) / millisec;
    std::cout << "\r" << "average: " 
              << std::left << std::setw(6)
              << words_per_sec << " words/sec." << std::endl;
  }
  std::cout << std::endl;
  std::cout << "save ..." << std::endl;
  save(output_prefix, cv, codebooks);

  return 0;
}